

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall
CLString::CLString(CLString *this,string *param_name,string *info,string *default_val,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                  *str_map)

{
  mapped_type *ppCVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_48;
  
  std::__cxx11::string::string((string *)&bStack_48,(string *)default_val);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::CLParam
            (&this->
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,param_name,info,&bStack_48);
  std::__cxx11::string::~string((string *)&bStack_48);
  (this->
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
  _vptr_CLParam = (_func_int **)&PTR__CLParam_00119c70;
  if ((this->
      super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).parameter_name_short == '\0') {
    (this->
    super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>)
    .parameter_name_short = '\x02';
  }
  ppCVar1 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
            ::operator[](str_map,&(this->
                                  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ).parameter_name);
  *ppCVar1 = this;
  return;
}

Assistant:

CLString(const std::string& param_name,
             const std::string& info,
             const std::string& default_val,
             std::map<std::string, CLString*> &str_map) :
    CLParam<std::string>(param_name, info, default_val)
    {
        if (parameter_name_short == 0) parameter_name_short = 2;
        str_map[parameter_name] = this ;
    }